

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall chrono::ChSystem::SetSolverType(ChSystem *this,Type type)

{
  ChSolverSparseLU *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ChLog *this_00;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined1 local_29;
  ChSolverSparseLU *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  if (type == CUSTOM) {
    return;
  }
  local_28 = (ChSolverSparseLU *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChSystemDescriptor,std::allocator<chrono::ChSystemDescriptor>>
            (&_Stack_20,(ChSystemDescriptor **)&local_28,
             (allocator<chrono::ChSystemDescriptor> *)&local_29);
  _Var2._M_pi = _Stack_20._M_pi;
  pCVar1 = local_28;
  local_28 = (ChSolverSparseLU *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->descriptor).
           super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->descriptor).super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pCVar1;
  (this->descriptor).super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  switch(type) {
  case PSOR:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverPSOR,std::allocator<chrono::ChSolverPSOR>>
              (&_Stack_20,(ChSolverPSOR **)&local_28,(allocator<chrono::ChSolverPSOR> *)&local_29);
    break;
  case PSSOR:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverPSSOR,std::allocator<chrono::ChSolverPSSOR>>
              (&_Stack_20,(ChSolverPSSOR **)&local_28,(allocator<chrono::ChSolverPSSOR> *)&local_29)
    ;
    break;
  case PJACOBI:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverPJacobi,std::allocator<chrono::ChSolverPJacobi>>
              (&_Stack_20,(ChSolverPJacobi **)&local_28,
               (allocator<chrono::ChSolverPJacobi> *)&local_29);
    break;
  case PMINRES:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverPMINRES,std::allocator<chrono::ChSolverPMINRES>>
              (&_Stack_20,(ChSolverPMINRES **)&local_28,
               (allocator<chrono::ChSolverPMINRES> *)&local_29);
    break;
  case BARZILAIBORWEIN:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverBB,std::allocator<chrono::ChSolverBB>>
              (&_Stack_20,(ChSolverBB **)&local_28,(allocator<chrono::ChSolverBB> *)&local_29);
    break;
  case APGD:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverAPGD,std::allocator<chrono::ChSolverAPGD>>
              (&_Stack_20,(ChSolverAPGD **)&local_28,(allocator<chrono::ChSolverAPGD> *)&local_29);
    break;
  default:
    this_00 = GetLog();
    ChStreamOutAscii::operator<<
              (&this_00->super_ChStreamOutAscii,
               "Solver type not supported. Use SetSolver instead.\n");
    return;
  case SPARSE_LU:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverSparseLU,std::allocator<chrono::ChSolverSparseLU>>
              (&_Stack_20,&local_28,(allocator<chrono::ChSolverSparseLU> *)&local_29);
    goto LAB_00521d74;
  case SPARSE_QR:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverSparseQR,std::allocator<chrono::ChSolverSparseQR>>
              (&_Stack_20,(ChSolverSparseQR **)&local_28,
               (allocator<chrono::ChSolverSparseQR> *)&local_29);
LAB_00521d74:
    p_Var4 = (this->solver).super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->solver).super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_28;
    (this->solver).super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_20._M_pi;
    goto LAB_00521e61;
  case GMRES:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverGMRES,std::allocator<chrono::ChSolverGMRES>>
              (&_Stack_20,(ChSolverGMRES **)&local_28,(allocator<chrono::ChSolverGMRES> *)&local_29)
    ;
    break;
  case MINRES:
    local_28 = (ChSolverSparseLU *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChSolverMINRES,std::allocator<chrono::ChSolverMINRES>>
              (&_Stack_20,(ChSolverMINRES **)&local_28,
               (allocator<chrono::ChSolverMINRES> *)&local_29);
  }
  peVar3 = (element_type *)
           &(local_28->super_ChDirectSolverLS).super_ChSolverLS.super_ChSolver.output_dir.
            _M_string_length;
  if (local_28 == (ChSolverSparseLU *)0x0) {
    peVar3 = (element_type *)0x0;
  }
  (this->solver).super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  p_Var4 = (this->solver).super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->solver).super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_20._M_pi;
LAB_00521e61:
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (ChSolverSparseLU *)0x0;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  return;
}

Assistant:

void ChSystem::SetSolverType(ChSolver::Type type) {
    // Do nothing if changing to a CUSTOM solver.
    if (type == ChSolver::Type::CUSTOM)
        return;

    descriptor = chrono_types::make_shared<ChSystemDescriptor>();

    switch (type) {
        case ChSolver::Type::PSOR:
            solver = chrono_types::make_shared<ChSolverPSOR>();
            break;
        case ChSolver::Type::PSSOR:
            solver = chrono_types::make_shared<ChSolverPSSOR>();
            break;
        case ChSolver::Type::PJACOBI:
            solver = chrono_types::make_shared<ChSolverPJacobi>();
            break;
        case ChSolver::Type::PMINRES:
            solver = chrono_types::make_shared<ChSolverPMINRES>();
            break;
        case ChSolver::Type::BARZILAIBORWEIN:
            solver = chrono_types::make_shared<ChSolverBB>();
            break;
        case ChSolver::Type::APGD:
            solver = chrono_types::make_shared<ChSolverAPGD>();
            break;
        case ChSolver::Type::GMRES:
            solver = chrono_types::make_shared<ChSolverGMRES>();
            break;
        case ChSolver::Type::MINRES:
            solver = chrono_types::make_shared<ChSolverMINRES>();
            break;
        case ChSolver::Type::SPARSE_LU:
            solver = chrono_types::make_shared<ChSolverSparseLU>();
            break;
        case ChSolver::Type::SPARSE_QR:
            solver = chrono_types::make_shared<ChSolverSparseQR>();
            break;
        default:
            GetLog() << "Solver type not supported. Use SetSolver instead.\n";
            break;
    }
}